

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::Config
          (ChISO2631_Vibration_SeatCushionLogger *this,double step)

{
  this->m_step = step;
  this->m_logging_time = 0.0;
  ChISO2631_1_Wd::Config(&this->m_filter_wd_x,step);
  ChISO2631_1_Wd::Config(&this->m_filter_wd_y,step);
  ChISO2631_1_Wk::Config(&this->m_filter_wk_z,step);
  ChAbsorbed_Power_Vertical::Config(&this->m_filter_abspow,step);
  (this->m_filter_int_aw_x).super_ChAnalogueFilter.m_step = step;
  (this->m_filter_int_aw_x).m_Ti = 1.0;
  (*(this->m_filter_int_aw_x).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])
            (&this->m_filter_int_aw_x);
  (this->m_filter_int_aw_y).super_ChAnalogueFilter.m_step = step;
  (this->m_filter_int_aw_y).m_Ti = 1.0;
  (*(this->m_filter_int_aw_y).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])
            (&this->m_filter_int_aw_y);
  (this->m_filter_int_aw_z).super_ChAnalogueFilter.m_step = step;
  (this->m_filter_int_aw_z).m_Ti = 1.0;
  (*(this->m_filter_int_aw_z).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])
            (&this->m_filter_int_aw_z);
  (this->m_filter_int_vdv_x).super_ChAnalogueFilter.m_step = step;
  (this->m_filter_int_vdv_x).m_Ti = 1.0;
  (*(this->m_filter_int_vdv_x).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])
            (&this->m_filter_int_vdv_x);
  (this->m_filter_int_vdv_y).super_ChAnalogueFilter.m_step = step;
  (this->m_filter_int_vdv_y).m_Ti = 1.0;
  (*(this->m_filter_int_vdv_y).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])
            (&this->m_filter_int_vdv_y);
  (this->m_filter_int_vdv_z).super_ChAnalogueFilter.m_step = step;
  (this->m_filter_int_vdv_z).m_Ti = 1.0;
  (*(this->m_filter_int_vdv_z).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])
            (&this->m_filter_int_vdv_z);
  Reset(this);
  return;
}

Assistant:

void ChISO2631_Vibration_SeatCushionLogger::Config(double step) {
    m_step = step;
    m_logging_time = 0.0;

    // prepare all filters for 1st usage
    m_filter_wd_x.Config(step);
    m_filter_wd_y.Config(step);
    m_filter_wk_z.Config(step);

    m_filter_abspow.Config(step);

    m_filter_int_aw_x.Config(step);
    m_filter_int_aw_y.Config(step);
    m_filter_int_aw_z.Config(step);

    m_filter_int_vdv_x.Config(step);
    m_filter_int_vdv_y.Config(step);
    m_filter_int_vdv_z.Config(step);

    Reset();
}